

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

void __thiscall
ncnn::ConvolutionDepthWise_x86::~ConvolutionDepthWise_x86(ConvolutionDepthWise_x86 *this)

{
  pointer ppLVar1;
  pointer ppLVar2;
  long lVar3;
  
  (this->super_ConvolutionDepthWise).super_Layer._vptr_Layer =
       (_func_int **)&PTR__ConvolutionDepthWise_x86_00145520;
  ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar1 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar1 - (long)ppLVar2) >> 3)) {
    lVar3 = 0;
    do {
      if (ppLVar2[lVar3] != (Layer *)0x0) {
        (*ppLVar2[lVar3]->_vptr_Layer[1])();
      }
      lVar3 = lVar3 + 1;
      ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppLVar1 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar3 < (int)((ulong)((long)ppLVar1 - (long)ppLVar2) >> 3));
  }
  if (ppLVar1 != ppLVar2) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar2;
  }
  if (ppLVar2 != (pointer)0x0) {
    operator_delete(ppLVar2,(long)(this->group_ops).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar2)
    ;
  }
  ConvolutionDepthWise::~ConvolutionDepthWise(&this->super_ConvolutionDepthWise);
  return;
}

Assistant:

ConvolutionDepthWise_x86::~ConvolutionDepthWise_x86()
{
    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();
}